

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

DirectionCone * __thiscall
pbrt::Triangle::NormalBounds(DirectionCone *__return_storage_ptr__,Triangle *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  lVar4 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar9 = (long)this->triIndex;
  lVar5 = *(long *)(lVar4 + 8);
  lVar6 = *(long *)(lVar4 + 0x10);
  lVar10 = (long)*(int *)(lVar5 + lVar9 * 0xc);
  lVar11 = (long)*(int *)(lVar5 + 4 + lVar9 * 0xc);
  lVar9 = (long)*(int *)(lVar5 + 8 + lVar9 * 0xc);
  lVar5 = *(long *)(lVar4 + 0x18);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(lVar6 + 4 + lVar10 * 0xc);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(lVar6 + 4 + lVar11 * 0xc);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar9 * 0xc)),
                          ZEXT416(*(uint *)(lVar6 + lVar11 * 0xc)),0x10);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar9 * 0xc)),
                          ZEXT416(*(uint *)(lVar6 + lVar9 * 0xc)),0x10);
  auVar13 = ZEXT416(*(uint *)(lVar6 + lVar10 * 0xc));
  auVar12 = vinsertps_avx(auVar15,auVar13,0x10);
  auVar14 = vsubps_avx(auVar14,auVar15);
  auVar22 = vsubps_avx(auVar16,auVar12);
  auVar16 = vinsertps_avx(auVar22,auVar14,0x4c);
  auVar12 = vpermt2ps_avx512vl(auVar15,_DAT_00447c50,auVar13);
  auVar15 = vsubps_avx(auVar18,auVar12);
  auVar18 = vinsertps_avx(auVar22,auVar15,0x1c);
  auVar12 = vmovshdup_avx(auVar15);
  auVar13 = vpermi2ps_avx512vl(_DAT_00447c60,auVar15,auVar14);
  auVar21._0_4_ = auVar22._0_4_ * auVar13._0_4_;
  auVar21._4_4_ = auVar22._4_4_ * auVar13._4_4_;
  auVar21._8_4_ = auVar22._8_4_ * auVar13._8_4_;
  auVar21._12_4_ = auVar22._12_4_ * auVar13._12_4_;
  auVar15 = vfmsub213ps_fma(auVar15,auVar14,auVar21);
  auVar16 = vfnmadd213ps_fma(auVar18,auVar16,auVar21);
  auVar13 = ZEXT416((uint)(auVar14._0_4_ * auVar12._0_4_));
  auVar18 = vfnmadd213ss_fma(auVar12,auVar14,auVar13);
  auVar12._0_4_ = auVar15._0_4_ + auVar16._0_4_;
  auVar12._4_4_ = auVar15._4_4_ + auVar16._4_4_;
  auVar12._8_4_ = auVar15._8_4_ + auVar16._8_4_;
  auVar12._12_4_ = auVar15._12_4_ + auVar16._12_4_;
  auVar16 = vmovshdup_avx(auVar22);
  auVar16 = vfmsub213ss_fma(auVar16,auVar22,auVar13);
  auVar22._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar22._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar22._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar22._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar18._0_4_ = auVar16._0_4_ + auVar18._0_4_;
  auVar16 = vhaddps_avx(auVar22,auVar22);
  auVar16 = ZEXT416((uint)(auVar18._0_4_ * auVar18._0_4_ + auVar16._0_4_));
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar19 = auVar16._0_4_;
  auVar13._4_4_ = fVar19;
  auVar13._0_4_ = fVar19;
  auVar13._8_4_ = fVar19;
  auVar13._12_4_ = fVar19;
  auVar18._0_4_ = auVar18._0_4_ / fVar19;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar16 = vdivps_avx(auVar12,auVar13);
  uVar17 = auVar16._8_4_;
  uVar8 = auVar16._12_4_;
  if (lVar5 == 0) {
    if (*(char *)(lVar4 + 0x38) != *(char *)(lVar4 + 0x39)) {
      auVar16._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = uVar17 ^ 0x80000000;
      auVar16._12_4_ = uVar8 ^ 0x80000000;
      auVar18._0_4_ = -auVar18._0_4_;
    }
  }
  else {
    uVar1 = *(undefined8 *)(lVar5 + 4 + lVar11 * 0xc);
    auVar14 = vpermi2ps_avx512vl(_DAT_00447c50,auVar16,auVar18);
    uVar2 = *(undefined8 *)(lVar5 + 4 + lVar10 * 0xc);
    uVar3 = *(undefined8 *)(lVar5 + 4 + lVar9 * 0xc);
    auVar25._0_4_ = (float)uVar2 + (float)uVar1 + (float)uVar3;
    auVar25._4_4_ =
         (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) +
         (float)((ulong)uVar3 >> 0x20);
    auVar25._8_8_ = 0;
    auVar12 = vmovshdup_avx(auVar25);
    fVar19 = auVar18._0_4_ * auVar12._0_4_;
    auVar26._0_4_ = -fVar19;
    auVar26._4_4_ = 0x80000000;
    auVar26._8_4_ = 0x80000000;
    auVar26._12_4_ = 0x80000000;
    auVar12 = vinsertps_avx(ZEXT416((uint)fVar19),auVar26,0x10);
    auVar12 = vfmadd231ps_fma(auVar12,auVar25,auVar14);
    auVar12 = vhaddps_avx(auVar12,auVar12);
    auVar12 = vfmadd231ss_fma(auVar12,auVar16,
                              ZEXT416((uint)(*(float *)(lVar5 + lVar10 * 0xc) +
                                             *(float *)(lVar5 + lVar11 * 0xc) +
                                            *(float *)(lVar5 + lVar9 * 0xc))));
    auVar24._0_12_ = ZEXT812(0);
    auVar24._12_4_ = 0;
    if (auVar12._0_4_ < 0.0) {
      auVar16._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = uVar17 ^ 0x80000000;
      auVar16._12_4_ = uVar8 ^ 0x80000000;
    }
    uVar1 = vcmpss_avx512f(auVar12,auVar24,1);
    bVar7 = (bool)((byte)uVar1 & 1);
    auVar18._0_4_ = (float)((uint)bVar7 * (int)-auVar18._0_4_ + (uint)!bVar7 * (int)auVar18._0_4_);
  }
  auVar20._0_4_ = auVar16._0_4_ * auVar16._0_4_;
  auVar20._4_4_ = auVar16._4_4_ * auVar16._4_4_;
  auVar20._8_4_ = auVar16._8_4_ * auVar16._8_4_;
  auVar20._12_4_ = auVar16._12_4_ * auVar16._12_4_;
  auVar12 = vhaddps_avx(auVar20,auVar20);
  auVar12 = ZEXT416((uint)(auVar18._0_4_ * auVar18._0_4_ + auVar12._0_4_));
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar19 = auVar12._0_4_;
  auVar23._4_4_ = fVar19;
  auVar23._0_4_ = fVar19;
  auVar23._8_4_ = fVar19;
  auVar23._12_4_ = fVar19;
  auVar16 = vdivps_avx(auVar16,auVar23);
  uVar1 = vmovlps_avx(auVar16);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_ / fVar19;
  __return_storage_ptr__->cosTheta = 1.0;
  __return_storage_ptr__->empty = false;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    const TriangleMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allTriangleMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }